

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDynamicLoader.cxx
# Opt level: O0

bool __thiscall cmDynamicLoaderCache::FlushCache(cmDynamicLoaderCache *this,char *path)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_60;
  byte local_55;
  bool ret;
  allocator local_41;
  key_type local_40;
  _Self local_20;
  iterator it;
  char *path_local;
  cmDynamicLoaderCache *this_local;
  
  it._M_node = (_Base_ptr)path;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,path,&local_41);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
       ::find(&this->CacheMap,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_55 = 0;
  local_60._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
       ::end(&this->CacheMap);
  bVar1 = std::operator!=(&local_20,&local_60);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>
             ::operator->(&local_20);
    cmsys::DynamicLoader::CloseLibrary(ppVar2->second);
    std::
    map<std::__cxx11::string,void*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void*>>>
    ::erase_abi_cxx11_((map<std::__cxx11::string,void*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void*>>>
                        *)this,(iterator)local_20._M_node);
    local_55 = 1;
  }
  return (bool)(local_55 & 1);
}

Assistant:

bool cmDynamicLoaderCache::FlushCache(const char* path)
{
  std::map<std::string, cmsys::DynamicLoader::LibraryHandle>::iterator it
    = this->CacheMap.find(path);
  bool ret = false;
  if ( it != this->CacheMap.end() )
    {
    cmsys::DynamicLoader::CloseLibrary(it->second);
    this->CacheMap.erase(it);
    ret = true;
    }
  return ret;
}